

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

chunk * cave_generate(player *p,wchar_t height,wchar_t width)

{
  quest *pqVar1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  player *c;
  chunk_conflict1 *pcVar5;
  object **ppoVar6;
  loc_conflict *plVar7;
  int *piVar8;
  loc_conflict **pplVar9;
  cave_profile *pcVar10;
  loc_conflict grid_00;
  square_conflict *psVar11;
  connector *pcVar12;
  feature *pfVar13;
  bitflag *pbVar14;
  connector *new;
  size_t n_1;
  loc_conflict grid_1;
  wchar_t n;
  loc_conflict grid;
  monster_group_info info;
  quest *q;
  dun_data dun_body;
  wchar_t x;
  wchar_t y;
  chunk *chunk;
  wchar_t tries;
  wchar_t i;
  char *error;
  wchar_t width_local;
  wchar_t height_local;
  player *p_local;
  
  _tries = "no generation";
  _x = (player *)0x0;
  error._0_4_ = width;
  error._4_4_ = height;
  _width_local = p;
  if ((p->upkeep->arena_level & 1U) == 0) {
    for (chunk._0_4_ = 0; (int)chunk < 100 && _tries != (char *)0x0; chunk._0_4_ = (int)chunk + 1) {
      _tries = (char *)0x0;
      character_dungeon = false;
      dun = (dun_data *)&q;
      plVar7 = (loc_conflict *)mem_zalloc((ulong)z_info->level_room_max << 3);
      dun->cent = plVar7;
      piVar8 = (int *)mem_zalloc((ulong)z_info->level_room_max << 2);
      dun->ent_n = piVar8;
      pplVar9 = (loc_conflict **)mem_zalloc((ulong)z_info->level_room_max << 3);
      dun->ent = pplVar9;
      dun->ent2room = (int **)0x0;
      plVar7 = (loc_conflict *)mem_zalloc((ulong)z_info->level_door_max << 3);
      dun->door = plVar7;
      plVar7 = (loc_conflict *)mem_zalloc((ulong)z_info->wall_pierce_max << 3);
      dun->wall = plVar7;
      plVar7 = (loc_conflict *)mem_zalloc((ulong)z_info->tunn_grid_max << 3);
      dun->tunn = plVar7;
      dun->join = (connector *)0x0;
      dun->one_off_above = (connector *)0x0;
      dun->one_off_below = (connector *)0x0;
      dun->curr_join = (connector *)0x0;
      dun->nstair_room = L'\0';
      _Var2 = is_quest(_width_local,(int)_width_local->depth);
      dun->quest = _Var2;
      if (((_width_local->opts).opt[0x2b] & 1U) == 0) {
        dun->persist = false;
      }
      else {
        dun->persist = true;
        get_join_info(_width_local,dun);
      }
      pcVar10 = choose_profile(_width_local);
      dun->profile = pcVar10;
      event_signal_string(EVENT_GEN_LEVEL_START,dun->profile->name);
      _x = (player *)
           (*dun->profile->builder)(_width_local,error._4_4_,(wchar_t)error,(char **)&tries);
      if (_x == (player *)0x0) {
        if (_tries == (char *)0x0) {
          _tries = "unspecified level builder failure";
        }
        if (((_width_local->opts).opt[0x18] & 1U) != 0) {
          msg("Generation restarted: %s.");
        }
        cleanup_dun_data(dun);
        event_signal_flag(EVENT_GEN_LEVEL_END,false);
      }
      else {
        if ((dun->quest & 1U) != 0) {
          for (chunk._4_4_ = 0; chunk._4_4_ < (int)(uint)z_info->quest_max;
              chunk._4_4_ = chunk._4_4_ + 1) {
            pqVar1 = player->quests;
            memset(&grid,0,8);
            if (((uint)pqVar1[chunk._4_4_].level == *(wchar_t *)((long)&_x->class + 4)) &&
               ((_Var2 = flag_has_dbg((pqVar1[chunk._4_4_].race)->flags,0xb,1,"q->race->flags",
                                      "RF_UNIQUE"), !_Var2 ||
                ((pqVar1[chunk._4_4_].race)->cur_num < L'\x01')))) {
              for (grid_1.x = L'\0'; grid_1.x < pqVar1[chunk._4_4_].max_num;
                  grid_1.x = grid_1.x + L'\x01') {
                find_empty((chunk_conflict *)_x,(loc *)&grid_1.y);
                place_new_monster((chunk *)_x,stack0xfffffffffffffef8,pqVar1[chunk._4_4_].race,true,
                                  true,(monster_group_info)grid,'\n');
              }
            }
          }
        }
        dun_body.quest = false;
        dun_body.persist = false;
        dun_body._174_2_ = 0;
        for (; (int)dun_body._172_4_ < *(wchar_t *)&_x->hitdie;
            dun_body._172_4_ = dun_body._172_4_ + 1) {
          for (dun_body.nstair_room = L'\0'; dun_body.nstair_room < *(wchar_t *)&_x->ht;
              dun_body.nstair_room = dun_body.nstair_room + L'\x01') {
            grid_00 = (loc_conflict)loc(dun_body.nstair_room,dun_body._172_4_);
            psVar11 = square((chunk *)_x,grid_00);
            flag_off(psVar11->info,3,0xb);
            psVar11 = square((chunk *)_x,grid_00);
            flag_off(psVar11->info,3,0xc);
            psVar11 = square((chunk *)_x,grid_00);
            flag_off(psVar11->info,3,0xd);
            psVar11 = square((chunk *)_x,grid_00);
            flag_off(psVar11->info,3,0xe);
            _Var2 = square_isstairs((chunk *)_x,grid_00);
            if (_Var2) {
              pcVar12 = (connector *)mem_zalloc(0x20);
              pcVar12->grid = grid_00;
              pfVar13 = square_feat((chunk *)_x,grid_00);
              pcVar12->feat = (uint8_t)pfVar13->fidx;
              pbVar14 = (bitflag *)mem_zalloc(3);
              pcVar12->info = pbVar14;
              for (new = (connector *)0x0; new < (connector *)0x3;
                  new = (connector *)((long)&(new->grid).x + 1)) {
                psVar11 = square((chunk *)_x,grid_00);
                pcVar12->info[(long)new] = psVar11->info[(long)new];
              }
              pcVar12->next = *(connector **)&_x->food;
              *(connector **)&_x->food = pcVar12;
            }
          }
        }
        wVar3 = cave_monster_max((chunk_conflict *)_x);
        if ((int)(uint)z_info->level_monster_max <= wVar3) {
          _tries = "too many monsters";
        }
        if (_tries != (char *)0x0) {
          if (((_width_local->opts).opt[0x18] & 1U) != 0) {
            msg("Generation restarted: %s.",_tries);
          }
          uncreate_artifacts((chunk_conflict *)_x);
          cave_clear((chunk *)_x,_width_local);
          event_signal_flag(EVENT_GEN_LEVEL_END,false);
        }
        cleanup_dun_data(dun);
      }
    }
    if (_tries != (char *)0x0) {
      quit_fmt("cave_generate() failed 100 times!");
    }
    if (_width_local->depth != 0) {
      place_feeling((chunk *)_x);
    }
    wVar3 = calc_obj_feeling((chunk *)_x,_width_local);
    wVar4 = calc_mon_feeling((chunk *)_x);
    *(char *)&(_x->grid).x = (char)wVar3 + (char)wVar4;
    chunk_validate_objects((chunk_conflict *)_x);
    pcVar5 = (chunk_conflict1 *)cave_new(*(wchar_t *)&_x->hitdie,*(wchar_t *)&_x->ht);
    _width_local->cave = pcVar5;
    _width_local->cave->depth = *(wchar_t *)((long)&_x->class + 4);
    ppoVar6 = (object **)
              mem_realloc(_width_local->cave->objects,
                          (long)(int)(*(uint16_t *)((long)_x->stat_cur + 8) + 1) << 3);
    _width_local->cave->objects = ppoVar6;
    _width_local->cave->obj_max = *(uint16_t *)((long)_x->stat_cur + 8);
    for (chunk._4_4_ = 0; chunk._4_4_ <= (int)(uint)_width_local->cave->obj_max;
        chunk._4_4_ = chunk._4_4_ + 1) {
      _width_local->cave->objects[chunk._4_4_] = (object *)0x0;
    }
    if ((_width_local->upkeep->light_level & 1U) != 0) {
      wiz_light((chunk *)_x,_width_local,false);
      _width_local->upkeep->light_level = false;
    }
    *(int32_t *)&_x->class = turn;
    p_local = _x;
  }
  else {
    event_signal_string(EVENT_GEN_LEVEL_START,"arena");
    c = (player *)arena_gen(_width_local,error._4_4_,(wchar_t)error);
    pcVar5 = (chunk_conflict1 *)cave_new(*(wchar_t *)&c->hitdie,*(wchar_t *)&c->ht);
    _width_local->cave = pcVar5;
    _width_local->cave->depth = *(wchar_t *)((long)&c->class + 4);
    ppoVar6 = (object **)
              mem_realloc(_width_local->cave->objects,
                          (long)(int)(*(uint16_t *)((long)c->stat_cur + 8) + 1) << 3);
    _width_local->cave->objects = ppoVar6;
    _width_local->cave->obj_max = *(uint16_t *)((long)c->stat_cur + 8);
    for (chunk._4_4_ = 0; chunk._4_4_ <= (int)(uint)_width_local->cave->obj_max;
        chunk._4_4_ = chunk._4_4_ + 1) {
      _width_local->cave->objects[chunk._4_4_] = (object *)0x0;
    }
    wiz_light((chunk *)c,_width_local,false);
    *(int32_t *)&c->class = turn;
    p_local = c;
  }
  return (chunk *)p_local;
}

Assistant:

static struct chunk *cave_generate(struct player *p, int height, int width)
{
	const char *error = "no generation";
	int i, tries = 0;
	struct chunk *chunk = NULL;

	/* Arena levels handled separately */
	if (p->upkeep->arena_level) {
		/* Generate level */
		event_signal_string(EVENT_GEN_LEVEL_START, "arena");
		chunk = arena_gen(p, height, width);

		/* Allocate new known level, light it if requested */
		p->cave = cave_new(chunk->height, chunk->width);
		p->cave->depth = chunk->depth;
		p->cave->objects = mem_realloc(p->cave->objects, (chunk->obj_max + 1)
									   * sizeof(struct object*));
		p->cave->obj_max = chunk->obj_max;
		for (i = 0; i <= p->cave->obj_max; i++) {
			p->cave->objects[i] = NULL;
		}

		wiz_light(chunk, p, false);
		chunk->turn = turn;

		return chunk;
	}

	/* Generate */
	for (tries = 0; tries < 100 && error; tries++) {
		int y, x;
		struct dun_data dun_body;

		error = NULL;

		/* Mark the dungeon as being unready (to avoid artifact loss, etc) */
		character_dungeon = false;

		/* Allocate global data (will be freed when we leave the loop) */
		dun = &dun_body;
		dun->cent = mem_zalloc(z_info->level_room_max * sizeof(struct loc));
		dun->ent_n = mem_zalloc(z_info->level_room_max * sizeof(*dun->ent_n));
		dun->ent = mem_zalloc(z_info->level_room_max * sizeof(*dun->ent));
		dun->ent2room = NULL;
		dun->door = mem_zalloc(z_info->level_door_max * sizeof(struct loc));
		dun->wall = mem_zalloc(z_info->wall_pierce_max * sizeof(struct loc));
		dun->tunn = mem_zalloc(z_info->tunn_grid_max * sizeof(struct loc));
		dun->join = NULL;
		dun->one_off_above = NULL;
		dun->one_off_below = NULL;
		dun->curr_join = NULL;
		dun->nstair_room = 0;
		dun->quest = is_quest(p, p->depth);

		/* Get connector info for persistent levels */
		if (OPT(p, birth_levels_persist)) {
			dun->persist = true;
			get_join_info(p, dun);
		} else {
			dun->persist = false;
		}


		/* Choose a profile and build the level */
		dun->profile = choose_profile(p);
		event_signal_string(EVENT_GEN_LEVEL_START, dun->profile->name);
		chunk = dun->profile->builder(p, height, width, &error);
		if (!chunk) {
			if (!error) {
				error = "unspecified level builder failure";
			}
			if (OPT(p, cheat_room)) {
				msg("Generation restarted: %s.", error);
			}
			cleanup_dun_data(dun);
			event_signal_flag(EVENT_GEN_LEVEL_END, false);
			continue;
		}

		/* Ensure quest monsters */
		if (dun->quest) {
			for (i = 0; i < z_info->quest_max; i++) {
				struct quest *q = &player->quests[i];
				struct monster_group_info info = { 0, 0 };
				struct loc grid;

				if (q->level != chunk->depth) continue;

				/* If the quest monster is unique and has already been placed, don't place again */
				if (rf_has(q->race->flags, RF_UNIQUE) && q->race->cur_num > 0) continue;

				/* Pick a location and place the monster(s) */
				for (int n = 0; n < q->max_num; n++) {
					find_empty(chunk, &grid);
					place_new_monster(chunk, grid, q->race, true, true, info,
									  ORIGIN_DROP);
				}
			}
		}

		/* Clear generation flags, add connecting info */
		for (y = 0; y < chunk->height; y++) {
			for (x = 0; x < chunk->width; x++) {
				struct loc grid = loc(x, y);

				sqinfo_off(square(chunk, grid)->info, SQUARE_WALL_INNER);
				sqinfo_off(square(chunk, grid)->info, SQUARE_WALL_OUTER);
				sqinfo_off(square(chunk, grid)->info, SQUARE_WALL_SOLID);
				sqinfo_off(square(chunk, grid)->info, SQUARE_MON_RESTRICT);

				if (square_isstairs(chunk, grid)) {
					size_t n;
					struct connector *new = mem_zalloc(sizeof *new);
					new->grid = grid;
					new->feat = square_feat(chunk, grid)->fidx;
					new->info = mem_zalloc(SQUARE_SIZE * sizeof(bitflag));
					for (n = 0; n < SQUARE_SIZE; n++) {
						new->info[n] = square(chunk, grid)->info[n];
					}
					new->next = chunk->join;
					chunk->join = new;
				}
			}
		}

		/* Regenerate levels that overflow their maxima */
		if (cave_monster_max(chunk) >= z_info->level_monster_max)
			error = "too many monsters";

		if (error) {
			if (OPT(p, cheat_room)) {
				msg("Generation restarted: %s.", error);
			}
			uncreate_artifacts(chunk);
			cave_clear(chunk, p);
			event_signal_flag(EVENT_GEN_LEVEL_END, false);
		}

		cleanup_dun_data(dun);
	}

	if (error) quit_fmt("cave_generate() failed 100 times!");

	/* Place dungeon squares to trigger feeling (not in town) */
	if (p->depth) {
		place_feeling(chunk);
	}

	chunk->feeling = calc_obj_feeling(chunk, p) + calc_mon_feeling(chunk);

	/* Validate the dungeon (we could use more checks here) */
	chunk_validate_objects(chunk);

	/* Allocate new known level, light it if requested */
	p->cave = cave_new(chunk->height, chunk->width);
	p->cave->depth = chunk->depth;
	p->cave->objects = mem_realloc(p->cave->objects, (chunk->obj_max + 1)
								   * sizeof(struct object*));
	p->cave->obj_max = chunk->obj_max;
	for (i = 0; i <= p->cave->obj_max; i++) {
		p->cave->objects[i] = NULL;
	}
	if (p->upkeep->light_level) {
		wiz_light(chunk, p, false);
		p->upkeep->light_level = false;
	}

	chunk->turn = turn;

	return chunk;
}